

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::visitLiteralExpr(CodegenVisitor *this,LiteralExpr *lit)

{
  LiteralKind LVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  ulong len;
  LiteralExpr *in_RSI;
  SQFuncState *in_RDI;
  int in_stack_0000000c;
  SQObject *in_stack_00000010;
  SQFuncState *in_stack_00000018;
  SQInteger in_stack_ffffffffffffffa0;
  SQFuncState *in_stack_ffffffffffffffa8;
  CodegenVisitor *in_stack_ffffffffffffffb0;
  SQInteger arg2;
  SQInteger in_stack_ffffffffffffffb8;
  CodegenVisitor *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  SQOpcode SVar4;
  undefined1 in_stack_ffffffffffffffe0 [16];
  
  SVar4 = (SQOpcode)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  maybeAddInExprLine(in_stack_ffffffffffffffb0,(Expr *)in_stack_ffffffffffffffa8);
  LVar1 = LiteralExpr::kind(in_RSI);
  len = (ulong)LVar1;
  switch(len) {
  case 0:
    SVar3 = in_RDI->_returnexp;
    SVar2 = SQFuncState::PushTarget(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    SVar4 = (SQOpcode)((ulong)SVar2 >> 0x20);
    SVar2 = in_RDI->_returnexp;
    arg2 = in_RDI->_returnexp;
    LiteralExpr::s(in_RSI);
    SQFuncState::CreateString(in_stack_ffffffffffffffe0._8_8_,in_stack_ffffffffffffffe0._0_8_,len);
    SQFuncState::GetConstant(in_stack_00000018,in_stack_00000010,in_stack_0000000c);
    SQFuncState::AddInstruction(in_RDI,SVar4,SVar3,SVar2,arg2,(SQInteger)in_stack_ffffffffffffffa8);
    break;
  case 1:
    LiteralExpr::i(in_RSI);
    EmitLoadConstInt(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (SQInteger)in_stack_ffffffffffffffb0);
    break;
  case 2:
    LiteralExpr::f(in_RSI);
    EmitLoadConstFloat(in_stack_ffffffffffffffb0,(SQFloat)((ulong)in_stack_ffffffffffffffa8 >> 0x20)
                       ,in_stack_ffffffffffffffa0);
    break;
  case 3:
    SVar3 = SQFuncState::PushTarget(in_stack_ffffffffffffffa8,in_RDI->_returnexp);
    LiteralExpr::b(in_RSI);
    SQFuncState::AddInstruction
              (in_RDI,SVar4,(SQInteger)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (SQInteger)in_stack_ffffffffffffffb0,SVar3);
    break;
  case 4:
    SQFuncState::PushTarget(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    SQFuncState::AddInstruction
              (in_RDI,SVar4,(SQInteger)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               (SQInteger)in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
  }
  return;
}

Assistant:

void CodegenVisitor::visitLiteralExpr(LiteralExpr *lit) {
    maybeAddInExprLine(lit);
    switch (lit->kind()) {
    case LK_STRING:
        _fs->AddInstruction(_OP_LOAD, _fs->PushTarget(), _fs->GetConstant(_fs->CreateString(lit->s())));
        break;
    case LK_FLOAT:EmitLoadConstFloat(lit->f(), -1); break;
    case LK_INT:  EmitLoadConstInt(lit->i(), -1); break;
    case LK_BOOL: _fs->AddInstruction(_OP_LOADBOOL, _fs->PushTarget(), lit->b()); break;
    case LK_NULL: _fs->AddInstruction(_OP_LOADNULLS, _fs->PushTarget(), 1); break;
    }
}